

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3DropTrigger(Parse *pParse,SrcList *pName,int noErr)

{
  int iVar1;
  int in_EDX;
  Parse *in_RSI;
  Parse *in_RDI;
  int j;
  sqlite3 *db;
  char *zName;
  char *zDb;
  int i;
  Trigger *pTrigger;
  uint uVar2;
  uint uVar3;
  sqlite3 *pParse_00;
  SrcList *pList;
  sqlite3 *db_00;
  uint local_24;
  void *local_20;
  undefined4 in_stack_ffffffffffffffe8;
  
  local_20 = (void *)0x0;
  db_00 = (sqlite3 *)&DAT_aaaaaaaaaaaaaaaa;
  pList = (SrcList *)&DAT_aaaaaaaaaaaaaaaa;
  pParse_00 = in_RDI->db;
  if ((pParse_00->mallocFailed == '\0') &&
     (iVar1 = sqlite3ReadSchema((Parse *)pParse_00), iVar1 == 0)) {
    db_00 = *(sqlite3 **)&in_RSI->nLabel;
    pList = (SrcList *)in_RSI->zErrMsg;
    for (local_24 = 0; (int)local_24 < pParse_00->nDb; local_24 = local_24 + 1) {
      uVar2 = local_24;
      if ((int)local_24 < 2) {
        uVar2 = local_24 ^ 1;
      }
      uVar3 = uVar2;
      if (((db_00 == (sqlite3 *)0x0) ||
          (iVar1 = sqlite3DbIsNamed(db_00,(int)((ulong)pList >> 0x20),(char *)pParse_00), iVar1 != 0
          )) && (local_20 = sqlite3HashFind((Hash *)pParse_00,(char *)CONCAT44(uVar3,uVar2)),
                local_20 != (void *)0x0)) break;
    }
    if (local_20 == (void *)0x0) {
      if (in_EDX == 0) {
        sqlite3ErrorMsg(in_RDI,"no such trigger: %S",&in_RSI->zErrMsg);
      }
      else {
        sqlite3CodeVerifyNamedSchema((Parse *)db_00,(char *)pList);
      }
      in_RDI->checkSchema = '\x01';
    }
    else {
      sqlite3DropTriggerPtr(in_RSI,(Trigger *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8));
    }
  }
  sqlite3SrcListDelete(db_00,pList);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3DropTrigger(Parse *pParse, SrcList *pName, int noErr){
  Trigger *pTrigger = 0;
  int i;
  const char *zDb;
  const char *zName;
  sqlite3 *db = pParse->db;

  if( db->mallocFailed ) goto drop_trigger_cleanup;
  if( SQLITE_OK!=sqlite3ReadSchema(pParse) ){
    goto drop_trigger_cleanup;
  }

  assert( pName->nSrc==1 );
  assert( pName->a[0].fg.fixedSchema==0 && pName->a[0].fg.isSubquery==0 );
  zDb = pName->a[0].u4.zDatabase;
  zName = pName->a[0].zName;
  assert( zDb!=0 || sqlite3BtreeHoldsAllMutexes(db) );
  for(i=OMIT_TEMPDB; i<db->nDb; i++){
    int j = (i<2) ? i^1 : i;  /* Search TEMP before MAIN */
    if( zDb && sqlite3DbIsNamed(db, j, zDb)==0 ) continue;
    assert( sqlite3SchemaMutexHeld(db, j, 0) );
    pTrigger = sqlite3HashFind(&(db->aDb[j].pSchema->trigHash), zName);
    if( pTrigger ) break;
  }
  if( !pTrigger ){
    if( !noErr ){
      sqlite3ErrorMsg(pParse, "no such trigger: %S", pName->a);
    }else{
      sqlite3CodeVerifyNamedSchema(pParse, zDb);
    }
    pParse->checkSchema = 1;
    goto drop_trigger_cleanup;
  }
  sqlite3DropTriggerPtr(pParse, pTrigger);

drop_trigger_cleanup:
  sqlite3SrcListDelete(db, pName);
}